

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::clara::detail::TokenStream::loadBuffer(TokenStream *this)

{
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  _Alloc_hider _Var6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  bool bVar9;
  string opt;
  undefined1 local_78 [8];
  _Alloc_hider local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = &this->m_tokenBuffer;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::resize
            (this_00,0);
  pbVar8 = (this->it)._M_current;
  pbVar1 = (this->itEnd)._M_current;
  bVar9 = pbVar8 == pbVar1;
  if (bVar9) {
    return;
  }
  pbVar3 = pbVar8;
  if (pbVar8->_M_string_length == 0) {
    do {
      pbVar8 = pbVar3 + 1;
      bVar9 = pbVar8 == pbVar1;
      if (bVar9) {
        (this->it)._M_current = pbVar8;
        return;
      }
      pbVar4 = pbVar3 + 1;
      pbVar3 = pbVar8;
    } while (pbVar4->_M_string_length == 0);
    (this->it)._M_current = pbVar8;
  }
  if (bVar9) {
    return;
  }
  if (*(pbVar8->_M_dataplus)._M_p == '-') {
    lVar5 = ::std::__cxx11::string::find_first_of((char *)pbVar8,0x170583,0);
    if (lVar5 != -1) {
      local_78._0_4_ = Option;
      ::std::__cxx11::string::substr((ulong)local_70,(ulong)pbVar8);
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
      emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70[0]._M_p != &local_60) {
        operator_delete(local_70[0]._M_p,local_60._M_allocated_capacity + 1);
      }
      local_78._0_4_ = Argument;
      ::std::__cxx11::string::substr((ulong)local_70,(ulong)pbVar8);
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
      emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
      _Var6._M_p = local_70[0]._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70[0]._M_p == &local_60) {
        return;
      }
      goto LAB_00145401;
    }
    if (((pbVar8->_M_dataplus)._M_p[1] != '-') && (2 < pbVar8->_M_string_length)) {
      local_50 = &local_40;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"- ","");
      if (1 < pbVar8->_M_string_length) {
        uVar7 = 1;
        do {
          local_50->_M_local_buf[1] = (pbVar8->_M_dataplus)._M_p[uVar7];
          local_78._0_4_ = Option;
          local_70[0]._M_p = (pointer)&local_60;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_70,local_50,local_50->_M_local_buf + local_48);
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70[0]._M_p != &local_60) {
            operator_delete(local_70[0]._M_p,local_60._M_allocated_capacity + 1);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < pbVar8->_M_string_length);
      }
      local_60._M_allocated_capacity = local_40._M_allocated_capacity;
      _Var6._M_p = (pointer)local_50;
      if (local_50 == &local_40) {
        return;
      }
      goto LAB_00145401;
    }
    local_78._0_4_ = Option;
    local_70[0]._M_p = (pointer)&local_60;
    pcVar2 = (pbVar8->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,pcVar2 + pbVar8->_M_string_length);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
    emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
  }
  else {
    local_78._0_4_ = Argument;
    local_70[0]._M_p = (pointer)&local_60;
    pcVar2 = (pbVar8->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,pcVar2 + pbVar8->_M_string_length);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
    emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
  }
  _Var6._M_p = local_70[0]._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_p == &local_60) {
    return;
  }
LAB_00145401:
  operator_delete(_Var6._M_p,local_60._M_allocated_capacity + 1);
  return;
}

Assistant:

void loadBuffer() {
            m_tokenBuffer.resize( 0 );

            // Skip any empty strings
            while( it != itEnd && it->empty() )
                ++it;

            if( it != itEnd ) {
                auto const &next = *it;
                if( isOptPrefix( next[0] ) ) {
                    auto delimiterPos = next.find_first_of( " :=" );
                    if( delimiterPos != std::string::npos ) {
                        m_tokenBuffer.push_back( { TokenType::Option, next.substr( 0, delimiterPos ) } );
                        m_tokenBuffer.push_back( { TokenType::Argument, next.substr( delimiterPos + 1 ) } );
                    } else {
                        if( next[1] != '-' && next.size() > 2 ) {
                            std::string opt = "- ";
                            for( size_t i = 1; i < next.size(); ++i ) {
                                opt[1] = next[i];
                                m_tokenBuffer.push_back( { TokenType::Option, opt } );
                            }
                        } else {
                            m_tokenBuffer.push_back( { TokenType::Option, next } );
                        }
                    }
                } else {
                    m_tokenBuffer.push_back( { TokenType::Argument, next } );
                }
            }
        }